

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O3

void __thiscall QPainter::drawPie(QPainter *this,QRectF *r,int a,int alen)

{
  double dVar1;
  long in_FS_OFFSET;
  QPainterPath path;
  QPainterPath local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>)
      *(tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor> *)
       &(((this->d_ptr)._M_t.
          super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
          super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
          super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl)->engine)._M_t ==
      (__uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>)0x0) {
    drawPie();
  }
  else {
    if (a < 0x1681) {
      if (a < 0) {
        a = (uint)-a % 0x1680;
        if (a != 0) {
          a = 0x1680 - a;
        }
      }
    }
    else {
      a = (uint)a % 0x1680;
    }
    local_68 = 0xffffffff;
    uStack_64 = 0xffffffff;
    uStack_60 = 0xffffffff;
    uStack_5c = 0xffffffff;
    local_78 = 0xffffffff;
    uStack_74 = 0xffffffff;
    uStack_70 = 0xffffffff;
    uStack_6c = 0xffffffff;
    QRectF::normalized();
    local_80.d_ptr.d.ptr = (QExplicitlySharedDataPointer<QPainterPathPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QPainterPath::QPainterPath(&local_80);
    dVar1 = (double)CONCAT44(uStack_5c,uStack_60) * 0.5 + (double)CONCAT44(uStack_6c,uStack_70);
    local_58.yp._0_4_ = SUB84(dVar1,0);
    local_58.xp = (double)CONCAT44(uStack_64,local_68) * 0.5 + (double)CONCAT44(uStack_74,local_78);
    local_58.yp._4_4_ = (int)((ulong)dVar1 >> 0x20);
    QPainterPath::moveTo(&local_80,(QPointF *)&local_58);
    local_58.xp._4_4_ = uStack_74;
    local_58.xp._0_4_ = local_78;
    local_58.yp._4_4_ = uStack_6c;
    local_58.yp._0_4_ = uStack_70;
    local_58.w = (qreal)CONCAT44(uStack_64,local_68);
    local_58.h = (qreal)CONCAT44(uStack_5c,uStack_60);
    QPainterPath::arcTo(&local_80,&local_58,(double)a * 0.0625,(double)alen * 0.0625);
    QPainterPath::closeSubpath(&local_80);
    drawPath(this,&local_80);
    QPainterPath::~QPainterPath(&local_80);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainter::drawPie(const QRectF &r, int a, int alen)
{
#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::drawPie(), [%.2f,%.2f,%.2f,%.2f], angle=%d, sweep=%d\n",
           r.x(), r.y(), r.width(), r.height(), a/16, alen/16);
#endif
    Q_D(QPainter);

    if (!d->engine) {
        qWarning("QPainter::drawPie: Painter not active");
        return;
    }

    if (a > (360*16)) {
        a = a % (360*16);
    } else if (a < 0) {
        a = a % (360*16);
        if (a < 0) a += (360*16);
    }

    QRectF rect = r.normalized();

    QPainterPath path;
    path.moveTo(rect.center());
    path.arcTo(rect.x(), rect.y(), rect.width(), rect.height(), a/16.0, alen/16.0);
    path.closeSubpath();
    drawPath(path);

}